

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

string * absl::Substitute_abi_cxx11_(string_view format,Arg *a0)

{
  string_view format_00;
  char *in_RCX;
  Nonnull<std::string_*> in_RDX;
  Arg *in_RSI;
  string *in_RDI;
  string *result;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  format_00._M_len._7_1_ = uVar1;
  format_00._M_len._0_7_ = in_stack_ffffffffffffffd8;
  format_00._M_str = in_RCX;
  SubstituteAndAppend(in_RDX,format_00,in_RSI);
  return in_RDI;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string Substitute(
    absl::string_view format, const substitute_internal::Arg& a0) {
  std::string result;
  SubstituteAndAppend(&result, format, a0);
  return result;
}